

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_service.c
# Opt level: O0

MPP_RET mpp_service_reg_offset(void *ctx,MppDevRegOffsetCfg *cfg)

{
  uint *puVar1;
  RegOffsetInfo *pRVar2;
  int local_34;
  RK_S32 i;
  RegOffsetInfo *info;
  MppDevMppService *p;
  MppDevRegOffsetCfg *cfg_local;
  void *ctx_local;
  
  if (cfg->offset == 0) {
    ctx_local._4_4_ = MPP_OK;
  }
  else if (*(int *)((long)ctx + 0x44) < 0x40) {
    for (local_34 = 0; local_34 < *(int *)((long)ctx + 0x44); local_34 = local_34 + 1) {
      puVar1 = (uint *)(*(long *)((long)ctx + 0x38) +
                       (long)(*(int *)((long)ctx + 0x48) + local_34) * 8);
      if (*puVar1 == cfg->reg_idx) {
        _mpp_log_l(2,"mpp_serivce","reg[%d] offset has been set, cover old %d -> %d\n",
                   "mpp_service_reg_offset",(ulong)*puVar1,(ulong)puVar1[1],cfg->offset);
        puVar1[1] = cfg->offset;
        return MPP_OK;
      }
    }
    pRVar2 = mpp_service_next_reg_offset((MppDevMppService *)ctx);
    pRVar2->reg_idx = cfg->reg_idx;
    pRVar2->offset = cfg->offset;
    ctx_local._4_4_ = MPP_OK;
  }
  else {
    _mpp_log_l(2,"mpp_serivce","reach max offset definition\n","mpp_service_reg_offset",0x40);
    ctx_local._4_4_ = MPP_NOK;
  }
  return ctx_local._4_4_;
}

Assistant:

MPP_RET mpp_service_reg_offset(void *ctx, MppDevRegOffsetCfg *cfg)
{
    MppDevMppService *p = (MppDevMppService *)ctx;
    RegOffsetInfo *info;
    RK_S32 i;

    if (!cfg->offset)
        return MPP_OK;

    if (p->reg_offset_count >= MAX_REG_OFFSET) {
        mpp_err_f("reach max offset definition\n", MAX_REG_OFFSET);
        return MPP_NOK;
    }

    for (i = 0; i < p->reg_offset_count; i++) {
        info = &p->reg_offset_info[p->reg_offset_pos + i];

        if (info->reg_idx == cfg->reg_idx) {
            mpp_err_f("reg[%d] offset has been set, cover old %d -> %d\n",
                      info->reg_idx, info->offset, cfg->offset);
            info->offset = cfg->offset;
            return MPP_OK;
        }
    }

    info = mpp_service_next_reg_offset(p);
    info->reg_idx = cfg->reg_idx;
    info->offset = cfg->offset;

    return MPP_OK;
}